

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlignDefault_CeilPtr_Test::TestBody
          (ArenaAlignDefault_CeilPtr_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  char p [17];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  char local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_18 [8];
  
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  local_28 = 0;
  uStack_20 = 0;
  local_18[0] = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x0;
  local_40._M_head_impl = local_48._M_head_impl;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_38,(char *)&local_40,(char **)"align_default.Ceil(p + 0)");
  if (local_38[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x3c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&uStack_20;
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&uStack_20;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_38,(char *)&local_40,(char **)"align_default.Ceil(p + 1)");
  if (local_38[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x3d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&uStack_20;
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&uStack_20;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_38,(char *)&local_40,(char **)"align_default.Ceil(p + 7)");
  if (local_38[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x3e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&uStack_20;
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&uStack_20;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_38,(char *)&local_40,(char **)"align_default.Ceil(p + 8)");
  if (local_38[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x3f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl = local_18;
  local_40._M_head_impl = local_18;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_38,(char *)&local_40,(char **)"align_default.Ceil(p + 9)");
  if (local_38[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x40,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&uStack_20;
  local_40._M_head_impl = local_18;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_38,(char *)&local_40,(char **)"align_default.Ceil(p + 15)");
  if (local_38[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x41,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl = local_18;
  local_40._M_head_impl = local_18;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_38,(char *)&local_40,(char **)"align_default.Ceil(p + 16)");
  if (local_38[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x42,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST(ArenaAlignDefault, CeilPtr) {
  alignas(8) char p[17] = {0};
  auto align_default = ArenaAlignDefault();
  EXPECT_THAT(align_default.Ceil(p + 0), Eq(p + 0));
  EXPECT_THAT(align_default.Ceil(p + 1), Eq(p + 8));
  EXPECT_THAT(align_default.Ceil(p + 7), Eq(p + 8));
  EXPECT_THAT(align_default.Ceil(p + 8), Eq(p + 8));
  EXPECT_THAT(align_default.Ceil(p + 9), Eq(p + 16));
  EXPECT_THAT(align_default.Ceil(p + 15), Eq(p + 16));
  EXPECT_THAT(align_default.Ceil(p + 16), Eq(p + 16));
}